

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::SourceBuffer>::emplaceRealloc<slang::SourceBuffer_const&>
          (SmallVectorBase<slang::SourceBuffer> *this,pointer pos,SourceBuffer *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pSVar4;
  long lVar5;
  pointer pSVar6;
  pointer pSVar7;
  iterator __result;
  size_t *in_RDX;
  iterator in_RSI;
  SmallVectorBase<slang::SourceBuffer> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  SourceBuffer *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = max_size((SmallVectorBase<slang::SourceBuffer> *)0x2d87eb);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  pSVar4 = begin(in_RDI);
  lVar5 = (long)__last - (long)pSVar4;
  pSVar6 = (pointer)operator_new(0x2d884a);
  pSVar7 = pSVar6 + (lVar5 >> 5);
  (pSVar7->data)._M_len = *in_RDX;
  (pSVar7->data)._M_str = (char *)in_RDX[1];
  pSVar7->library = (SourceLibrary *)in_RDX[2];
  *(size_t *)&pSVar7->id = in_RDX[3];
  pSVar4 = end(in_RDI);
  if (in_RSI == pSVar4) {
    __result = begin(in_RDI);
    pSVar4 = end(in_RDI);
    std::uninitialized_move<slang::SourceBuffer*,slang::SourceBuffer*>(in_RSI,__last,__result);
  }
  else {
    begin(in_RDI);
    std::uninitialized_move<slang::SourceBuffer*,slang::SourceBuffer*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    pSVar4 = end(in_RDI);
    std::uninitialized_move<slang::SourceBuffer*,slang::SourceBuffer*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  cleanup(in_RDI,(EVP_PKEY_CTX *)pSVar4);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = pSVar6;
  return pSVar7;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}